

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

ssize_t __thiscall
capnp::_::anon_unknown_0::TestVat::ConnectionImpl::OutgoingRpcMessageImpl::send
          (OutgoingRpcMessageImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  MallocMessageBuilder *builder;
  uint *puVar1;
  Iface *pIVar2;
  TaskSet *this_00;
  long lVar3;
  SourceLocation location;
  ArrayPtr<const_capnp::word> array;
  Promise<void> PVar4;
  char *pcVar5;
  int iVar6;
  undefined4 extraout_var;
  IncomingRpcMessageImpl *pIVar8;
  void *pvVar9;
  ConnectionImpl *extraout_RAX;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:402:13)>
  *location_00;
  ReaderOptions options;
  Promise<void> blocker;
  DebugExpression<bool> _kjCondition;
  undefined7 uStackY_f7;
  ForkHub<kj::_::Void> *pFVar10;
  IncomingRpcMessageImpl *pIVar11;
  WirePointer *in_stack_ffffffffffffff20;
  void *continuationTracePtr;
  char *pcStack_c0;
  IncomingRpcMessageImpl *local_b8;
  Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> local_a8;
  OwnPromiseNode local_90;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_88;
  char *pcStack_80;
  undefined8 local_78;
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,_std::nullptr_t>
  incomingMessage;
  ConnectionImpl *pCVar7;
  
  pCVar7 = this->connection;
  __kjCondition = (PromiseNode *)(CONCAT71(uStackY_f7,pCVar7->idle) ^ 1);
  if ((pCVar7->idle != false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[34],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x173,ERROR,"\"failed: expected \" \"!connection.idle\", _kjCondition",
               (char (*) [34])"failed: expected !connection.idle",&_kjCondition);
    pCVar7 = this->connection;
  }
  builder = &this->message;
  pIVar2 = (pCVar7->vat->sendCallback).impl.ptr;
  iVar6 = (**pIVar2->_vptr_Iface)(pIVar2,builder);
  pCVar7 = (ConnectionImpl *)CONCAT44(extraout_var,iVar6);
  if (((char)iVar6 != '\0') &&
     (pCVar7 = this->connection, (pCVar7->networkException).ptr.isSet == false)) {
    puVar1 = &pCVar7->vat->sent;
    *puVar1 = *puVar1 + 1;
    messageToFlatArray((Array<capnp::word> *)&continuationTracePtr,&builder->super_MessageBuilder);
    pIVar8 = (IncomingRpcMessageImpl *)operator_new(0x130);
    pcVar5 = pcStack_c0;
    pvVar9 = continuationTracePtr;
    array.size_ = (size_t)pcStack_c0;
    array.ptr = (word *)continuationTracePtr;
    continuationTracePtr = (void *)0x0;
    pcStack_c0 = (char *)0x0;
    (pIVar8->super_Refcounted).refcount = 0;
    (pIVar8->super_IncomingRpcMessage)._vptr_IncomingRpcMessage =
         (_func_int **)&PTR_getBody_0064fca0;
    (pIVar8->super_Refcounted).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_0064fcd8;
    (pIVar8->data).ptr = (word *)pvVar9;
    (pIVar8->data).size_ = (size_t)pcVar5;
    (pIVar8->data).disposer = (ArrayDisposer *)local_b8;
    __kjCondition = (PromiseNode *)0x0;
    pFVar10 = (ForkHub<kj::_::Void> *)0x0;
    options._8_8_ = 0x40;
    options.traversalLimitInWords = 0x800000;
    pIVar11 = local_b8;
    FlatArrayMessageReader::FlatArrayMessageReader(&pIVar8->message,array,options);
    incomingMessage.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl>
          ::instance;
    incomingMessage.ptr = pIVar8;
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)&_kjCondition);
    kj::Array<capnp::word>::~Array((Array<capnp::word> *)&continuationTracePtr);
    blocker.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    if ((this->connection->currentBlock).ptr.isSet == true) {
      kj::ForkedPromise<void>::addBranch((ForkedPromise<void> *)&_kjCondition);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&blocker,
                 (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
    }
    else {
      kj::yield();
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&blocker,
                 (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&_kjCondition);
      pCVar7 = this->connection;
      if ((pCVar7->blockAfterPredicate).ptr.isSet == true) {
        MessageBuilder::getRoot<capnp::rpc::Message>
                  ((Builder *)&_kjCondition,&builder->super_MessageBuilder);
        StructBuilder::asReader((StructBuilder *)&_kjCondition);
        iVar6 = (**((pCVar7->blockAfterPredicate).ptr.field_1.value.impl.ptr)->_vptr_Iface)();
        if ((char)iVar6 != '\0') {
          pCVar7 = this->connection;
          continuationTracePtr = anon_var_dwarf_2442a3;
          pcStack_c0 = "block";
          local_b8 = (IncomingRpcMessageImpl *)0x120000013d;
          location.function = (char *)pIVar11;
          location.fileName = (char *)pFVar10;
          location._16_8_ = in_stack_ffffffffffffff20;
          kj::newPromiseAndFulfiller<void>(location);
          local_88.ptr = (PromiseNode *)0x44f85b;
          pcStack_80 = "block";
          local_78 = 0x160000013e;
          kj::Promise<void>::fork((Promise<void> *)&local_a8);
          kj::_::NullableValue<kj::ForkedPromise<void>>::emplace<kj::ForkedPromise<void>>
                    ((NullableValue<kj::ForkedPromise<void>> *)&pCVar7->currentBlock,
                     (ForkedPromise<void> *)&local_a8);
          kj::Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose(&local_a8);
          local_a8.disposer = (Disposer *)pFVar10;
          kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
                    (&(pCVar7->currentBlockFulfiller).ptr,
                     (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&local_a8);
          kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
                    ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&local_a8);
          kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair
                    ((PromiseFulfillerPair<void> *)&_kjCondition);
          kj::Maybe<kj::Function<bool_(capnp::rpc::Message::Reader)>_>::operator=
                    (&this->connection->blockAfterPredicate);
        }
      }
    }
    PVar4.super_PromiseBase.node.ptr = blocker.super_PromiseBase.node.ptr;
    __kjCondition = (PromiseNode *)this->connection;
    this_00 = (((ConnectionImpl *)__kjCondition)->tasks).ptr;
    incomingMessage.ptr = (IncomingRpcMessageImpl *)0x0;
    continuationTracePtr =
         kj::_::
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:402:13)>
         ::anon_class_24_2_d9090f80_for_func::operator();
    lVar3 = *(long *)((long)blocker.super_PromiseBase.node.ptr + 8);
    if (lVar3 == 0 || (ulong)((long)blocker.super_PromiseBase.node.ptr - lVar3) < 0x38) {
      pvVar9 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:402:13)>
                     *)((long)pvVar9 + 0x3c8);
      kj::
      ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::OutgoingRpcMessageImpl::send()::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::OutgoingRpcMessageImpl::send()::_lambda()_1_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&blocker,
                 (anon_class_24_2_d9090f80_for_func *)&_kjCondition,&continuationTracePtr);
      *(void **)((long)pvVar9 + 0x3d0) = pvVar9;
    }
    else {
      *(undefined8 *)((long)blocker.super_PromiseBase.node.ptr + 8) = 0;
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:402:13)>
                     *)((long)blocker.super_PromiseBase.node.ptr + -0x38);
      kj::
      ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::OutgoingRpcMessageImpl::send()::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::OutgoingRpcMessageImpl::send()::_lambda()_1_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&blocker,
                 (anon_class_24_2_d9090f80_for_func *)&_kjCondition,&continuationTracePtr);
      *(long *)((long)PVar4.super_PromiseBase.node.ptr + -0x30) = lVar3;
    }
    local_88.ptr = (PromiseNode *)0x0;
    local_a8.disposer = (Disposer *)0x0;
    local_90.ptr = (PromiseNode *)location_00;
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_a8);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_88);
    kj::TaskSet::add(this_00,(Promise<void> *)&local_90);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_90);
    kj::
    Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,_std::nullptr_t>
    ::~Own((Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,_std::nullptr_t>
            *)&stack0xffffffffffffff10);
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&blocker);
    kj::
    Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl::IncomingRpcMessageImpl,_std::nullptr_t>
    ::~Own(&incomingMessage);
    pCVar7 = extraout_RAX;
  }
  return (ssize_t)pCVar7;
}

Assistant:

void send() override {
        KJ_EXPECT(!connection.idle);
        if (!connection.vat.sendCallback(message)) return;

        if (connection.networkException != kj::none) {
          return;
        }

        ++connection.vat.sent;

        // Uncomment to get a debug dump.
//        connection.dumper.dump(message.getRoot<rpc::Message>());

        auto incomingMessage = kj::heap<IncomingRpcMessageImpl>(messageToFlatArray(message));

        kj::Promise<void> blocker = nullptr;
        KJ_IF_SOME(b, connection.currentBlock) {
          blocker = b.addBranch();
        } else {
          blocker = kj::yield();

          // Check if we should start blocking.
          KJ_IF_SOME(p, connection.blockAfterPredicate) {
            if (p(message.getRoot<rpc::Message>())) {
              connection.block();
              connection.blockAfterPredicate = kj::none;
            }
          }
        }